

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_limb_t mpn_mul(mp_ptr rp,mp_srcptr up,mp_size_t un,mp_srcptr vp,mp_size_t vn)

{
  mp_limb_t mVar1;
  long local_30;
  mp_size_t vn_local;
  mp_srcptr vp_local;
  mp_size_t un_local;
  mp_srcptr up_local;
  mp_ptr rp_local;
  
  if (un < vn) {
    __assert_fail("un >= vn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x241,"mp_limb_t mpn_mul(mp_ptr, mp_srcptr, mp_size_t, mp_srcptr, mp_size_t)");
  }
  if (0 < vn) {
    mVar1 = mpn_mul_1(rp,up,un,*vp);
    rp[un] = mVar1;
    local_30 = vn;
    vn_local = (mp_size_t)vp;
    up_local = rp;
    while (local_30 = local_30 + -1, 0 < local_30) {
      up_local = up_local + 1;
      vn_local = vn_local + 8;
      mVar1 = mpn_addmul_1(up_local,up,un,*(mp_limb_t *)vn_local);
      up_local[un] = mVar1;
    }
    return up_local[un];
  }
  __assert_fail("vn >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x242,"mp_limb_t mpn_mul(mp_ptr, mp_srcptr, mp_size_t, mp_srcptr, mp_size_t)");
}

Assistant:

mp_limb_t
mpn_mul (mp_ptr rp, mp_srcptr up, mp_size_t un, mp_srcptr vp, mp_size_t vn)
{
  assert (un >= vn);
  assert (vn >= 1);

  /* We first multiply by the low order limb. This result can be
     stored, not added, to rp. We also avoid a loop for zeroing this
     way. */

  rp[un] = mpn_mul_1 (rp, up, un, vp[0]);

  /* Now accumulate the product of up[] and the next higher limb from
     vp[]. */

  while (--vn >= 1)
    {
      rp += 1, vp += 1;
      rp[un] = mpn_addmul_1 (rp, up, un, vp[0]);
    }
  return rp[un];
}